

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall FileEntryInfo::addExtent(FileEntryInfo *this,Extent *extent)

{
  pointer pEVar1;
  long lVar2;
  
  pEVar1 = (this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((((this->m_extents).super__Vector_base<Extent,_std::allocator<Extent>_>._M_impl.
        super__Vector_impl_data._M_start == pEVar1) ||
      ((int)(pEVar1[-1].size / 0x800) + pEVar1[-1].lbnPos != extent->lbnPos)) ||
     (lVar2 = pEVar1[-1].size + extent->size, 0x3fffffff < lVar2)) {
    std::vector<Extent,_std::allocator<Extent>_>::push_back(&this->m_extents,extent);
  }
  else {
    pEVar1[-1].size = lVar2;
  }
  this->m_fileSize = this->m_fileSize + extent->size;
  return;
}

Assistant:

void FileEntryInfo::addExtent(const Extent &extent)
{
    if (m_extents.empty())
    {
        m_extents.push_back(extent);
    }
    else
    {
        const int lastLBN = m_extents.rbegin()->lbnPos + static_cast<int>(m_extents.rbegin()->size / SECTOR_SIZE);
        if (lastLBN == extent.lbnPos && m_extents.rbegin()->size + extent.size < MAX_EXTENT_SIZE)
            m_extents.rbegin()->size += extent.size;
        else
            m_extents.push_back(extent);
    }
    m_fileSize += extent.size;
}